

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost12sum.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  FILE *pFVar7;
  char *pcVar8;
  char *pcVar9;
  int hashsize;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  int expected_hash_size;
  char sum_2 [129];
  gost2012_hash_ctx ctx;
  char calcsum [129];
  char sum [129];
  uint local_1294;
  int local_128c;
  char **local_1288;
  FILE *local_1280;
  undefined8 local_1278;
  char *local_1270;
  char local_1268 [144];
  gost2012_hash_ctx local_11d8;
  char local_10c8 [143];
  char local_1039;
  char local_1038 [4104];
  
  local_1278 = 0;
  bVar2 = true;
  bVar1 = false;
  iVar4 = 0x20;
  pFVar7 = (FILE *)0x0;
  do {
    while( true ) {
      do {
        hashsize = iVar4;
        iVar3 = getopt(argc,argv,"hxlvc::");
        iVar4 = 0x40;
      } while (iVar3 == 0x6c);
      if (iVar3 < 0x76) break;
      if (iVar3 == 0x76) {
        local_1278 = 1;
        bVar2 = false;
        iVar4 = hashsize;
      }
      else {
        if (iVar3 != 0x78) {
LAB_00101410:
          fprintf(_stderr,"invalid option %c\n",(ulong)_optopt);
          help();
LAB_00101436:
          local_128c = 0;
          if (((pFVar7 != _stdin) || (argc <= _optind)) ||
             (pFVar7 = fopen(argv[_optind],"r"), pFVar7 != (FILE *)0x0)) {
            local_1280 = pFVar7;
            iVar4 = get_line((FILE *)pFVar7,local_1268,local_1038,(int)local_1278,&local_128c);
            uVar11 = 0;
            local_1294 = 0;
            uVar10 = 0;
            if (iVar4 != 0) {
              local_1270 = "%s\tFAILED\n";
              if (bVar2) {
                local_1270 = "%s: GOST hash sum check failed\n";
              }
              uVar10 = 0;
              local_1294 = 0;
              uVar11 = 0;
              local_1288 = argv;
              do {
                lVar12 = (long)local_128c;
                if (lVar12 == 0) {
                  fprintf(_stderr,"%s: invalid hash length\n",local_1038);
                  uVar11 = uVar11 + 1;
                  pFVar7 = local_1280;
                }
                else {
                  uVar5 = hash_file(&local_11d8,local_1038,local_10c8,0,local_128c);
                  uVar11 = (uVar5 ^ 1) + uVar11;
                  argv = local_1288;
                  pFVar7 = local_1280;
                  if (uVar5 != 0) {
                    iVar4 = strncmp(local_10c8,local_1268,lVar12 * 2 + 1);
                    pFVar7 = local_1280;
                    if (iVar4 == 0) {
                      argv = local_1288;
                      if (!bVar2) {
                        fprintf(_stderr,"%s\tOK\n",local_1038);
                        argv = local_1288;
                      }
                    }
                    else {
                      fprintf(_stderr,local_1270,local_1038);
                      local_1294 = local_1294 + 1;
                      argv = local_1288;
                    }
                  }
                }
                uVar10 = (ulong)((int)uVar10 + 1);
                iVar4 = get_line((FILE *)pFVar7,local_1268,local_1038,(int)local_1278,&local_128c);
              } while (iVar4 != 0);
            }
            if (uVar11 != 0) {
              fprintf(_stderr,"%s: WARNING %d of %d file(s) cannot be processed\n",*argv,
                      (ulong)uVar11,uVar10);
            }
            if (local_1294 != 0) {
              fprintf(_stderr,"%s: WARNING %d of %d processed file(s) failed GOST hash sum check\n",
                      *argv,(ulong)local_1294,(ulong)((int)uVar10 - uVar11));
            }
            local_1294 = local_1294 | uVar11;
            goto LAB_00101776;
          }
          pcVar8 = argv[_optind];
          goto LAB_001017a6;
        }
        bVar1 = true;
        iVar4 = hashsize;
      }
    }
    if (iVar3 != 99) {
      if (iVar3 != -1) {
        if (iVar3 != 0x68) goto LAB_00101410;
        help();
      }
      iVar4 = _optind;
      if (pFVar7 != (FILE *)0x0) goto LAB_00101436;
      if (bVar1) {
        iVar4 = feof(_stdin);
        local_1294 = 0;
        if (iVar4 != 0) goto LAB_00101776;
        local_1294 = 0;
        goto LAB_00101543;
      }
      if (argc == _optind) {
        iVar4 = fileno(_stdin);
        iVar4 = hash_stream(&local_11d8,iVar4,local_1038,hashsize);
        if (iVar4 != 0) {
          printf("%s -\n",local_1038);
          exit(0);
        }
        perror("stdin");
        exit(1);
      }
      local_1294 = 0;
      if (_optind < argc) {
        iVar3 = argc - _optind;
        lVar12 = 0;
        local_1294 = 0;
        do {
          iVar6 = hash_file(&local_11d8,argv[iVar4 + lVar12],local_1038,0,hashsize);
          if (iVar6 == 0) {
            local_1294 = local_1294 + 1;
          }
          else {
            printf("%s %s\n",local_1038,argv[iVar4 + lVar12]);
          }
          lVar12 = lVar12 + 1;
        } while (iVar3 != (int)lVar12);
      }
      goto LAB_00101776;
    }
    iVar4 = hashsize;
    pFVar7 = _stdin;
  } while ((_optarg == (char *)0x0) ||
          (pFVar7 = fopen(_optarg,"r"), pcVar8 = _optarg, pFVar7 != (FILE *)0x0));
LAB_001017a6:
  perror(pcVar8);
  exit(2);
  while( true ) {
    pcVar8 = &local_1039;
    do {
      pcVar9 = pcVar8;
      pcVar8 = pcVar9 + 1;
    } while (pcVar9[1] != '\0');
    for (; (*pcVar9 == '\r' || (*pcVar9 == '\n')); pcVar9 = pcVar9 + -1) {
      *pcVar9 = '\0';
    }
    iVar4 = hash_file(&local_11d8,local_1038,local_1268,0,hashsize);
    if (iVar4 == 0) {
      local_1294 = local_1294 + 1;
    }
    else {
      printf("%s %s\n",local_1268,local_1038);
    }
    iVar4 = feof(_stdin);
    if (iVar4 != 0) break;
LAB_00101543:
    pcVar8 = fgets(local_1038,0x1000,_stdin);
    if (pcVar8 == (char *)0x0) break;
  }
LAB_00101776:
  exit((uint)(local_1294 != 0));
}

Assistant:

int main(int argc, char **argv)
{
    int c, i;
    int verbose = 0;
    int errors = 0;
    int open_mode = O_RDONLY | O_BINARY;
    FILE *check_file = NULL;
    int filenames_from_stdin = 0;
    int hashsize = 32;
    gost_hash_ctx ctx;

    while ((c = getopt(argc, argv, "hxlvc::")) != -1) {
        switch (c) {
        case 'h':
            help();
            exit(0);
            break;
        case 'v':
            verbose = 1;
            break;
        case 'l':
            hashsize = 64;
            break;
        case 'x':
            filenames_from_stdin = 1;
            break;
        case 'c':
            if (optarg) {
                check_file = fopen(optarg, "r");
                if (!check_file) {
                    perror(optarg);
                    exit(2);
                }
            } else {
                check_file = stdin;
            }
            break;
        default:
            fprintf(stderr, "invalid option %c\n", optopt);
            help();
        }
    }

    if (check_file) {
        char inhash[MAX_HASH_TXT_BYTES + 1], calcsum[MAX_HASH_TXT_BYTES + 1],
            filename[PATH_MAX];
        int failcount = 0, count = 0;
        int expected_hash_size = 0;
        if (check_file == stdin && optind < argc) {
            check_file = fopen(argv[optind], "r");
            if (!check_file) {
                perror(argv[optind]);
                exit(2);
            }
        }
        while (get_line
               (check_file, inhash, filename, verbose, &expected_hash_size)) {
            int error = 0;
            if (expected_hash_size == 0) {
                fprintf(stderr, "%s: invalid hash length\n", filename);
                errors++;
                count++;
                continue;
            }

            if (!hash_file
                (&ctx, filename, calcsum, open_mode, expected_hash_size)) {
                errors++;
                error = 1;
            }
            count++;
            if (error)
                continue;

            if (!strncmp(calcsum, inhash, expected_hash_size * 2 + 1)) {
                if (verbose) {
                    fprintf(stderr, "%s\tOK\n", filename);
                }
            } else {
                if (verbose) {
                    fprintf(stderr, "%s\tFAILED\n", filename);
                } else {
                    fprintf(stderr, "%s: GOST hash sum check failed\n",
                            filename);
                }
                failcount++;
            }
        }
        if (errors) {
            fprintf(stderr,
                    "%s: WARNING %d of %d file(s) cannot be processed\n",
                    argv[0], errors, count);

        }
        if (failcount) {
            fprintf(stderr,
                    "%s: WARNING %d of %d processed file(s) failed GOST hash sum check\n",
                    argv[0], failcount, count - errors);
        }
        exit((failcount || errors) ? 1 : 0);
    } else if (filenames_from_stdin) {
        char sum[MAX_HASH_TXT_BYTES + 1];
        char filename[PATH_MAX + 1], *end;
        while (!feof(stdin)) {
            if (!fgets(filename, PATH_MAX, stdin))
                break;
            for (end = filename; *end; end++) ;
            end--;
            for (; *end == '\n' || *end == '\r'; end--)
                *end = 0;
            if (!hash_file(&ctx, filename, sum, open_mode, hashsize)) {
                errors++;
            } else {
                printf("%s %s\n", sum, filename);
            }
        }

    } else if (optind == argc) {
        char sum[MAX_HASH_TXT_BYTES + 1];
        if (!hash_stream(&ctx, fileno(stdin), sum, hashsize)) {
            perror("stdin");
            exit(1);
        }
        printf("%s -\n", sum);
        exit(0);
    } else {
        for (i = optind; i < argc; i++) {
            char sum[MAX_HASH_TXT_BYTES + 1];
            if (!hash_file(&ctx, argv[i], sum, open_mode, hashsize)) {
                errors++;
            } else {
                printf("%s %s\n", sum, argv[i]);
            }
        }
    }
    exit(errors ? 1 : 0);
}